

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSParser::parsePlayListMark(MPLSParser *this,uint8_t *buffer,int len)

{
  uint local_50;
  unsigned_short local_4c;
  uchar local_49;
  uint32_t mark_time_stamp;
  unsigned_short ref_to_PlayItem_id;
  unsigned_short uStack_42;
  uchar mark_type;
  int PL_mark_id;
  unsigned_short number_of_PlayList_marks;
  BitStreamReader reader;
  int len_local;
  uint8_t *buffer_local;
  MPLSParser *this_local;
  
  reader.m_bitLeft = len;
  BitStreamReader::BitStreamReader((BitStreamReader *)&PL_mark_id);
  BitStreamReader::setBuffer((BitStreamReader *)&PL_mark_id,buffer,buffer + (int)reader.m_bitLeft);
  BitStreamReader::skipBits((BitStreamReader *)&PL_mark_id,0x20);
  uStack_42 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)&PL_mark_id,0x10);
  for (mark_time_stamp = 0; (int)mark_time_stamp < (int)(uint)uStack_42;
      mark_time_stamp = mark_time_stamp + 1) {
    BitStreamReader::skipBits((BitStreamReader *)&PL_mark_id,8);
    local_49 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)&PL_mark_id,8);
    local_4c = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)&PL_mark_id,0x10);
    local_50 = BitStreamReader::getBits((BitStreamReader *)&PL_mark_id,0x20);
    BitStreamReader::skipBits((BitStreamReader *)&PL_mark_id,0x10);
    BitStreamReader::skipBits((BitStreamReader *)&PL_mark_id,0x20);
    if (local_49 == '\x01') {
      std::vector<PlayListMark,std::allocator<PlayListMark>>::
      emplace_back<unsigned_short_const&,unsigned_int_const&>
                ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,&local_4c,
                 &local_50);
    }
  }
  return;
}

Assistant:

void MPLSParser::parsePlayListMark(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + len);
    reader.skipBits(32);  // length
    const auto number_of_PlayList_marks = reader.getBits<uint16_t>(16);
    for (int PL_mark_id = 0; PL_mark_id < number_of_PlayList_marks; PL_mark_id++)
    {
        reader.skipBits(8);  // reserved_for_future_use
        const auto mark_type = reader.getBits<uint8_t>(8);
        const auto ref_to_PlayItem_id = reader.getBits<uint16_t>(16);
        const uint32_t mark_time_stamp = reader.getBits(32);
        reader.skipBits(16);  // entry_ES_PID
        reader.skipBits(32);  // duration
        if (mark_type == 1)   // mark_type 0x01 = Chapter search
            m_marks.emplace_back(ref_to_PlayItem_id, mark_time_stamp);
    }
}